

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlNewParserCtxt(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  htmlParserCtxtPtr val;
  htmlParserCtxtPtr ret_val;
  int mem_base;
  int test_ret;
  
  iVar1 = xmlMemBlocks();
  val = (htmlParserCtxtPtr)htmlNewParserCtxt();
  desret_htmlParserCtxtPtr(val);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    printf("Leak of %d blocks found in htmlNewParserCtxt",(ulong)(uint)(iVar3 - iVar1));
    printf("\n");
  }
  ret_val._4_4_ = (uint)(iVar1 != iVar2);
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_htmlNewParserCtxt(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED)
    int mem_base;
    htmlParserCtxtPtr ret_val;

        mem_base = xmlMemBlocks();

        ret_val = htmlNewParserCtxt();
        desret_htmlParserCtxtPtr(ret_val);
        call_tests++;
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlNewParserCtxt",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf("\n");
        }
    function_tests++;
#endif

    return(test_ret);
}